

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O0

int fy_atom_memcmp(fy_atom *atom,void *ptr,size_t len)

{
  uint uVar1;
  size_t sVar2;
  char *__s1;
  int local_24c;
  size_t local_248;
  uint local_238;
  int ret;
  int ct;
  int c;
  fy_atom_iter iter;
  size_t tlen;
  size_t dlen;
  char *str;
  char *dstr;
  size_t len_local;
  void *ptr_local;
  fy_atom *atom_local;
  
  if (((atom == (fy_atom *)0x0) && (ptr == (void *)0x0)) && (len == 0)) {
    atom_local._4_4_ = 0;
  }
  else if ((atom == (fy_atom *)0x0) && ((ptr != (void *)0x0 || (len != 0)))) {
    atom_local._4_4_ = -1;
  }
  else if ((atom == (fy_atom *)0x0) || ((ptr != (void *)0x0 && (len != 0)))) {
    if ((*(uint *)&atom->field_0x34 >> 10 & 1) == 0) {
      local_238 = 0xffffffff;
      fy_atom_iter_start(atom,(fy_atom_iter *)&ct);
      dstr = (char *)len;
      for (dlen = (size_t)ptr;
          (uVar1 = fy_atom_iter_getc((fy_atom_iter *)&ct), -1 < (int)uVar1 && dstr != (char *)0x0 &&
          (local_238 = (uint)*(byte *)dlen, local_238 == uVar1)); dlen = dlen + 1) {
        dstr = dstr + -1;
      }
      fy_atom_iter_finish((fy_atom_iter *)&ct);
      if ((uVar1 == 0xffffffff) && (dstr == (char *)0x0)) {
        atom_local._4_4_ = 0;
      }
      else {
        atom_local._4_4_ = 1;
        if ((int)uVar1 < (int)local_238) {
          atom_local._4_4_ = -1;
        }
      }
    }
    else {
      sVar2 = fy_atom_size(atom);
      __s1 = fy_atom_data(atom);
      local_248 = sVar2;
      if (len < sVar2) {
        local_248 = len;
      }
      iter._480_8_ = local_248;
      atom_local._4_4_ = memcmp(__s1,ptr,local_248);
      if (atom_local._4_4_ == 0) {
        if (sVar2 == len) {
          local_24c = 0;
        }
        else {
          local_24c = 1;
          if (sVar2 < len) {
            local_24c = -1;
          }
        }
        atom_local._4_4_ = local_24c;
      }
    }
  }
  else {
    atom_local._4_4_ = 1;
  }
  return atom_local._4_4_;
}

Assistant:

int fy_atom_memcmp(struct fy_atom *atom, const void *ptr, size_t len) {
    const char *dstr, *str;
    size_t dlen, tlen;
    struct fy_atom_iter iter;
    int c, ct, ret;

    /* empty? just fine */
    if (!atom && !ptr && !len)
        return 0;

    /* empty atom but not ptr */
    if (!atom && (ptr || len))
        return -1;

    /* non empty atom and empty ptr */
    if (atom && (!ptr || !len))
        return 1;

    /* direct output, nice */
    if (atom->direct_output) {
        dlen = fy_atom_size(atom);
        dstr = fy_atom_data(atom);
        tlen = dlen > len ? len : dlen;
        ret = memcmp(dstr, ptr, tlen);
        if (ret)
            return ret;

        return dlen == len ? 0 : len > dlen ? -1 : 1;
    }

    str = ptr;
    ct = -1;
    fy_atom_iter_start(atom, &iter);
    while ((c = fy_atom_iter_getc(&iter)) >= 0 && len) {
        ct = *str & 0xff;
        if (ct != c)
            break;
        str++;
        len--;
    }
    fy_atom_iter_finish(&iter);

    /* out of data on both */
    if (c == -1 && !len)
        return 0;

    return ct > c ? -1 : 1;
}